

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<unsigned_short>,short,duckdb::BitXorOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  ushort *puVar2;
  byte *pbVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  char *pcVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  ushort uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  idx_t iVar16;
  idx_t iVar17;
  idx_t iVar18;
  ulong uVar19;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      pdVar7 = input->data;
      pdVar8 = states->data;
      FlatVector::VerifyFlatVector(input);
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        if (count == 0) {
          return;
        }
        iVar16 = 0;
        do {
          pcVar6 = *(char **)(pdVar8 + iVar16 * 8);
          uVar12 = *(ushort *)(pdVar7 + iVar16 * 2);
          if (*pcVar6 == '\0') {
            *pcVar6 = '\x01';
          }
          else {
            uVar12 = uVar12 ^ *(ushort *)(pcVar6 + 2);
          }
          *(ushort *)(pcVar6 + 2) = uVar12;
          iVar16 = iVar16 + 1;
        } while (count != iVar16);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar11 = 0;
      uVar14 = 0;
      do {
        uVar9 = puVar1[uVar11];
        uVar13 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar13 = count;
        }
        uVar15 = uVar13;
        if (uVar9 != 0) {
          uVar15 = uVar14;
          if (uVar9 == 0xffffffffffffffff) {
            if (uVar14 < uVar13) {
              do {
                pcVar6 = *(char **)(pdVar8 + uVar14 * 8);
                uVar12 = *(ushort *)(pdVar7 + uVar14 * 2);
                if (*pcVar6 == '\0') {
                  *pcVar6 = '\x01';
                }
                else {
                  uVar12 = uVar12 ^ *(ushort *)(pcVar6 + 2);
                }
                *(ushort *)(pcVar6 + 2) = uVar12;
                uVar14 = uVar14 + 1;
                uVar15 = uVar13;
              } while (uVar13 != uVar14);
            }
          }
          else if (uVar14 < uVar13) {
            uVar19 = 0;
            do {
              if ((uVar9 >> (uVar19 & 0x3f) & 1) != 0) {
                pcVar6 = *(char **)(pdVar8 + uVar19 * 8 + uVar14 * 8);
                if (*pcVar6 == '\0') {
                  *(ushort *)(pcVar6 + 2) = *(ushort *)(pdVar7 + uVar19 * 2 + uVar14 * 2);
                  *pcVar6 = '\x01';
                }
                else {
                  *(ushort *)(pcVar6 + 2) =
                       *(ushort *)(pcVar6 + 2) ^ *(ushort *)(pdVar7 + uVar19 * 2 + uVar14 * 2);
                }
              }
              uVar19 = uVar19 + 1;
              uVar15 = uVar13;
            } while (uVar13 - uVar14 != uVar19);
          }
        }
        uVar11 = uVar11 + 1;
        uVar14 = uVar15;
      } while (uVar11 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      return;
    }
    if (count == 0) {
      return;
    }
    puVar2 = (ushort *)input->data;
    pbVar3 = *(byte **)states->data;
    bVar10 = *pbVar3;
    do {
      uVar12 = *puVar2;
      if ((bVar10 & 1) == 0) {
        *pbVar3 = 1;
        bVar10 = 1;
      }
      else {
        uVar12 = uVar12 ^ *(ushort *)(pbVar3 + 2);
      }
      *(ushort *)(pbVar3 + 2) = uVar12;
      count = count - 1;
    } while (count != 0);
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(input,count,&local_b8);
  Vector::ToUnifiedFormat(states,count,&local_70);
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = (local_b8.sel)->sel_vector;
      psVar5 = (local_70.sel)->sel_vector;
      iVar16 = 0;
      do {
        iVar17 = iVar16;
        if (psVar4 != (sel_t *)0x0) {
          iVar17 = (idx_t)psVar4[iVar16];
        }
        iVar18 = iVar16;
        if (psVar5 != (sel_t *)0x0) {
          iVar18 = (idx_t)psVar5[iVar16];
        }
        pcVar6 = *(char **)(local_70.data + iVar18 * 8);
        uVar12 = *(ushort *)(local_b8.data + iVar17 * 2);
        if (*pcVar6 == '\0') {
          *pcVar6 = '\x01';
        }
        else {
          uVar12 = uVar12 ^ *(ushort *)(pcVar6 + 2);
        }
        *(ushort *)(pcVar6 + 2) = uVar12;
        iVar16 = iVar16 + 1;
      } while (count != iVar16);
    }
  }
  else if (count != 0) {
    psVar4 = (local_b8.sel)->sel_vector;
    psVar5 = (local_70.sel)->sel_vector;
    iVar16 = 0;
    do {
      iVar17 = iVar16;
      if (psVar4 != (sel_t *)0x0) {
        iVar17 = (idx_t)psVar4[iVar16];
      }
      iVar18 = iVar16;
      if (psVar5 != (sel_t *)0x0) {
        iVar18 = (idx_t)psVar5[iVar16];
      }
      if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar17 >> 6]
           >> (iVar17 & 0x3f) & 1) != 0) {
        pcVar6 = *(char **)(local_70.data + iVar18 * 8);
        if (*pcVar6 == '\0') {
          *(ushort *)(pcVar6 + 2) = *(ushort *)(local_b8.data + iVar17 * 2);
          *pcVar6 = '\x01';
        }
        else {
          *(ushort *)(pcVar6 + 2) =
               *(ushort *)(pcVar6 + 2) ^ *(ushort *)(local_b8.data + iVar17 * 2);
        }
      }
      iVar16 = iVar16 + 1;
    } while (count != iVar16);
  }
  if (local_70.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}